

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipoint-counter.cpp
# Opt level: O1

bool __thiscall mahjong::MinipointCounter::isNoPointsHandSelfDrawn(MinipointCounter *this)

{
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  pointer __x;
  Meld it;
  Meld local_50;
  
  bVar2 = WiningState::isWinByDiscard(this->state);
  if (!bVar2) {
    __x = (this->hand->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
          _M_impl.super__Vector_impl_data._M_start;
    pMVar1 = (this->hand->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar2 = __x == pMVar1;
    if (!bVar2) {
      bVar4 = false;
      do {
        std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector
                  (&local_50.tiles,&__x->tiles);
        local_50.is_open = __x->is_open;
        bVar3 = Meld::isOpen(&local_50);
        if ((bVar3) || (bVar3 = Meld::isTripletOrQuad(&local_50), bVar3)) {
          bVar3 = false;
        }
        else {
          bVar4 = Meld::isMultiWait(&local_50,this->hand->last_tile);
          bVar3 = true;
        }
        if (local_50.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.tiles.
                                super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.tiles.
                                super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (!bVar3) break;
        __x = __x + 1;
        bVar2 = __x == pMVar1;
      } while (!bVar2);
      return (bool)(bVar2 & bVar4);
    }
  }
  return false;
}

Assistant:

bool MinipointCounter::isNoPointsHandSelfDrawn() const
{
	if (state.isWinByDiscard()) return false;

	auto is_multi_wait = false;
	for (auto it : hand.melds)
	{
		if (it.isOpen()) return false;
		if (it.isTripletOrQuad()) return false;

		is_multi_wait = it.isMultiWait(hand.last_tile);
	}

	return is_multi_wait;
}